

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall SmallArray<Lexeme,_32U>::grow(SmallArray<Lexeme,_32U> *this,uint newSize)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Allocator *pAVar4;
  Lexeme *pLVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  int iVar12;
  undefined4 extraout_var;
  Lexeme *pLVar13;
  long lVar14;
  uint i;
  uint uVar15;
  ulong uVar16;
  
  uVar15 = (this->max >> 1) + this->max;
  uVar6 = newSize + 4;
  if (newSize < uVar15) {
    uVar6 = uVar15;
  }
  pAVar4 = this->allocator;
  if (pAVar4 == (Allocator *)0x0) {
    pLVar13 = (Lexeme *)(*(code *)NULLC::alloc)(uVar6 << 5 | 4);
  }
  else {
    iVar12 = (*pAVar4->_vptr_Allocator[2])(pAVar4,(ulong)(uVar6 << 5 | 4));
    pLVar13 = (Lexeme *)CONCAT44(extraout_var,iVar12);
  }
  lVar14 = 0;
  uVar16 = 0;
  while( true ) {
    pLVar5 = this->data;
    if (this->count <= uVar16) break;
    puVar1 = (undefined4 *)((long)&pLVar5->type + lVar14);
    uVar7 = *puVar1;
    uVar8 = puVar1[1];
    uVar9 = puVar1[2];
    uVar10 = puVar1[3];
    puVar2 = (undefined8 *)((long)&pLVar5->length + lVar14);
    uVar11 = puVar2[1];
    puVar3 = (undefined8 *)((long)&pLVar13->length + lVar14);
    *puVar3 = *puVar2;
    puVar3[1] = uVar11;
    puVar1 = (undefined4 *)((long)&pLVar13->type + lVar14);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    puVar1[2] = uVar9;
    puVar1[3] = uVar10;
    uVar16 = uVar16 + 1;
    lVar14 = lVar14 + 0x20;
  }
  if (pLVar5 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pLVar5 != (Lexeme *)0x0) {
        (*(code *)NULLC::dealloc)(pLVar5);
      }
    }
    else if (pLVar5 != (Lexeme *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pLVar13;
  this->max = uVar6;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}